

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  uint uVar2;
  uint local_34;
  UInt32 dest;
  UInt32 src;
  UInt32 i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  
  if (size < 4) {
    data_local = (Byte *)0x0;
  }
  else {
    for (dest = 0; (ulong)dest <= size - 4; dest = dest + 4) {
      if (((data[dest] == '@') && ((data[dest + 1] & 0xc0) == 0)) ||
         ((data[dest] == '\x7f' && ((data[dest + 1] & 0xc0) == 0xc0)))) {
        if (encoding == 0) {
          iVar1 = -(ip + dest);
        }
        else {
          iVar1 = ip + dest;
        }
        local_34 = iVar1 + ((uint)data[dest + 1] << 0x10 | (uint)data[dest + 2] << 8 |
                           (uint)data[dest + 3]) * 4;
        iVar1 = (-(local_34 >> 0x18 & 1) & 0xff) << 0x16;
        uVar2 = local_34 >> 2 & 0x3fffff;
        data[dest] = (byte)((uint)iVar1 >> 0x18) | 0x40;
        data[dest + 1] = (byte)((uint)iVar1 >> 0x10) | (byte)(uVar2 >> 0x10);
        data[dest + 2] = (Byte)(uVar2 >> 8);
        data[dest + 3] = (Byte)uVar2;
      }
    }
    data_local = (Byte *)(ulong)dest;
  }
  return (SizeT)data_local;
}

Assistant:

static SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}